

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_error_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ulong uVar1;
  ulong uVar2;
  int64_t iVar3;
  JSValue JVar4;
  JSValue JVar5;
  
  if ((int)this_val.tag == -1) {
    JVar4 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
    if ((int)JVar4.tag == 3) {
      JVar4 = JS_AtomToString(ctx,0x91);
    }
    else {
      JVar4 = JS_ToStringFree(ctx,JVar4);
    }
    if ((JVar4.tag & 0xffffffffU) != 6) {
      JVar5 = JS_GetPropertyInternal(ctx,this_val,0x33,this_val,0);
      if ((int)JVar5.tag == 3) {
        JVar5 = JS_AtomToString(ctx,0x2f);
      }
      else {
        JVar5 = JS_ToStringFree(ctx,JVar5);
      }
      if ((JVar5.tag & 0xffffffffU) != 6) {
        if ((((int)JVar4.tag != -7) || ((*(uint *)((long)JVar4.u.ptr + 4) & 0x7fffffff) != 0)) &&
           (((int)JVar5.tag != -7 || ((*(uint *)((long)JVar5.u.ptr + 4) & 0x7fffffff) != 0)))) {
          JVar4 = JS_ConcatString3(ctx,"",JVar4,": ");
        }
        JVar4 = JS_ConcatString(ctx,JVar4,JVar5);
        iVar3 = JVar4.tag;
        uVar2 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
        uVar1 = (ulong)JVar4.u._0_4_;
        goto LAB_0015122d;
      }
      JS_FreeValue(ctx,JVar4);
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar3 = 6;
  uVar1 = 0;
  uVar2 = 0;
LAB_0015122d:
  JVar4.u.ptr = (void *)(uVar1 | uVar2);
  JVar4.tag = iVar3;
  return JVar4;
}

Assistant:

static JSValue js_error_toString(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue name, msg;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
    if (JS_IsUndefined(name))
        name = JS_AtomToString(ctx, JS_ATOM_Error);
    else
        name = JS_ToStringFree(ctx, name);
    if (JS_IsException(name))
        return JS_EXCEPTION;

    msg = JS_GetProperty(ctx, this_val, JS_ATOM_message);
    if (JS_IsUndefined(msg))
        msg = JS_AtomToString(ctx, JS_ATOM_empty_string);
    else
        msg = JS_ToStringFree(ctx, msg);
    if (JS_IsException(msg)) {
        JS_FreeValue(ctx, name);
        return JS_EXCEPTION;
    }
    if (!JS_IsEmptyString(name) && !JS_IsEmptyString(msg))
        name = JS_ConcatString3(ctx, "", name, ": ");
    return JS_ConcatString(ctx, name, msg);
}